

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.h
# Opt level: O0

int __thiscall Assimp::LWOImporter::ReadVSizedIntLWO2(LWOImporter *this,uint8_t **inout)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint local_1c;
  int c;
  int i;
  uint8_t **inout_local;
  LWOImporter *this_local;
  
  uVar1 = **inout;
  *inout = *inout + 1;
  if (uVar1 == 0xff) {
    bVar3 = **inout;
    *inout = *inout + 1;
    bVar4 = **inout;
    *inout = *inout + 1;
    bVar5 = **inout;
    *inout = *inout + 1;
    local_1c = (uint)bVar5 | (uint)bVar4 << 8 | (uint)bVar3 << 0x10;
  }
  else {
    uVar2 = **inout;
    *inout = *inout + 1;
    local_1c = (uint)CONCAT11(uVar1,uVar2);
  }
  return local_1c;
}

Assistant:

inline int LWOImporter::ReadVSizedIntLWO2(uint8_t*& inout)
{
    int i;
    int c = *inout;inout++;
    if(c != 0xFF)
    {
        i = c << 8;
        c = *inout;inout++;
        i |= c;
    }
    else
    {
        c = *inout;inout++;
        i = c << 16;
        c = *inout;inout++;
        i |= c << 8;
        c = *inout;inout++;
        i |= c;
    }
    return i;
}